

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IsGroupOf_PDU.cpp
# Opt level: O0

void __thiscall KDIS::PDU::IsGroupOf_PDU::Encode(IsGroupOf_PDU *this,KDataStream *stream)

{
  KDataStream *pKVar1;
  size_type sVar2;
  const_reference this_00;
  GED *pGVar3;
  byte local_19;
  KUINT8 i;
  KDataStream *stream_local;
  IsGroupOf_PDU *this_local;
  
  Header7::Encode(&this->super_Header,stream);
  pKVar1 = DATA_TYPE::operator<<(stream,(DataTypeBase *)&this->m_GroupedEntityID);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui8GrpdEntCat);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui8NumOfGroupedEnts);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui32Padding1);
  pKVar1 = KDataStream::operator<<(pKVar1,(double)this->m_f64GrpLat);
  KDataStream::operator<<(pKVar1,(double)this->m_f64GrpLon);
  local_19 = 0;
  while( true ) {
    sVar2 = std::
            vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>_>_>
            ::size(&this->m_vpGED);
    if (sVar2 <= local_19) break;
    this_00 = std::
              vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>_>_>
              ::operator[](&this->m_vpGED,(ulong)local_19);
    pGVar3 = UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>::operator->(this_00);
    (*(pGVar3->super_DataTypeBase)._vptr_DataTypeBase[5])(pGVar3,stream);
    local_19 = local_19 + 1;
  }
  return;
}

Assistant:

void IsGroupOf_PDU::Encode( KDataStream & stream ) const
{
    Header::Encode( stream );

    stream << KDIS_STREAM m_GroupedEntityID
           << m_ui8GrpdEntCat
           << m_ui8NumOfGroupedEnts
           << m_ui32Padding1
           << m_f64GrpLat
           << m_f64GrpLon;

    KUINT8 i = 0;

    while( i < m_vpGED.size() )
    {
        m_vpGED[i]->Encode( stream );
        ++i;
    }
}